

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManSpecBuildInit
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int f,int fDualOut)

{
  Gia_Rpr_t GVar1;
  int *piVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  
  pGVar4 = p->pObjs;
  if (pGVar4 <= pObj) {
    iVar3 = p->nObjs;
    lVar6 = (long)iVar3;
    if (pObj < pGVar4 + lVar6) {
      iVar10 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      GVar1 = p->pReprs[iVar10];
      uVar8 = (ulong)(uint)GVar1 & 0xfffffff;
      if (uVar8 != 0xfffffff) {
        if (iVar3 <= (int)uVar8) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((pGVar4 != (Gia_Obj_t *)0x0) &&
           ((fDualOut == 0 || (0x3fffffff < ((uint)p->pReprs[uVar8] ^ (uint)GVar1))))) {
          uVar9 = (int)uVar8 + iVar3 * f;
          if ((-1 < (int)uVar9) && (uVar5 = (p->vCopies).nSize, (int)uVar9 < (int)uVar5)) {
            piVar2 = (p->vCopies).pArray;
            uVar9 = piVar2[uVar9];
            if ((int)uVar9 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            uVar7 = iVar3 * f + iVar10;
            if ((-1 < (int)uVar7) && (uVar7 < uVar5)) {
              uVar9 = uVar9 ^ ((uint)((ulong)*(undefined8 *)
                                              ((ulong)(pGVar4 + uVar8) & 0xfffffffffffffffe) >> 0x3f
                                     ) ^ (uint)(pGVar4 + uVar8) & 1) !=
                              ((uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >>
                                     0x3f) ^ (uint)pObj & 1);
              if ((((uint)GVar1 >> 0x1c & 1) == 0) && (uVar5 = piVar2[uVar7], uVar5 != uVar9)) {
                iVar3 = Gia_ManHashXor(pNew,uVar5,uVar9);
                Vec_IntPush(vXorLits,iVar3);
                iVar3 = p->nObjs;
                pGVar4 = p->pObjs;
                lVar6 = (long)iVar3;
              }
              if ((pGVar4 <= pObj) && (pObj < pGVar4 + lVar6)) {
                uVar5 = (int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555 + iVar3 * f;
                if ((-1 < (int)uVar5) && ((int)uVar5 < (p->vCopies).nSize)) {
                  (p->vCopies).pArray[uVar5] = uVar9;
                  return;
                }
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              goto LAB_00200287;
            }
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
      }
      return;
    }
  }
LAB_00200287:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSpecBuildInit( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int f, int fDualOut )
{
    Gia_Obj_t * pRepr;
    int iLitNew;
    pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
    if ( pRepr == NULL )
        return;
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
        return;
    iLitNew = Abc_LitNotCond( Gia_ObjCopyF(p, f, pRepr), Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
    if ( Gia_ObjCopyF(p, f, pObj) != iLitNew && !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
        Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, Gia_ObjCopyF(p, f, pObj), iLitNew) );
    Gia_ObjSetCopyF( p, f, pObj, iLitNew );
}